

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O2

void gen_vmladduhm(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_ptr pTVar1;
  TCGv_ptr pTVar2;
  TCGv_ptr pTVar3;
  TCGv_ptr pTVar4;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  if (ctx->altivec_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    pTVar1 = gen_avr_ptr(tcg_ctx,*(ushort *)((long)&ctx->opcode + 2) & 0x1f);
    pTVar2 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0xb & 0x1f);
    pTVar3 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 6 & 0x1f);
    pTVar4 = gen_avr_ptr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
    local_48 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    local_38 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    local_30 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_vmladduhm_ppc64,(TCGTemp *)0x0,4,&local_48);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_vmladduhm(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_ptr ra, rb, rc, rd;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    ra = gen_avr_ptr(tcg_ctx, rA(ctx->opcode));
    rb = gen_avr_ptr(tcg_ctx, rB(ctx->opcode));
    rc = gen_avr_ptr(tcg_ctx, rC(ctx->opcode));
    rd = gen_avr_ptr(tcg_ctx, rD(ctx->opcode));
    gen_helper_vmladduhm(tcg_ctx, rd, ra, rb, rc);
    tcg_temp_free_ptr(tcg_ctx, ra);
    tcg_temp_free_ptr(tcg_ctx, rb);
    tcg_temp_free_ptr(tcg_ctx, rc);
    tcg_temp_free_ptr(tcg_ctx, rd);
}